

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  MMS mm_00;
  CTState *cts_00;
  ushort uVar1;
  IRRef1 IVar2;
  CTypeID CVar3;
  TRef TVar4;
  GCcdata *pGVar5;
  CType *pCVar6;
  uint *puVar7;
  CTypeID local_3ac;
  BCIns *pc;
  MMS mm;
  TRef tr_1;
  CType *cct;
  GCobj *pGStack_388;
  CTSize ofs;
  GCstr *str;
  TRef local_378;
  CTypeID id_1;
  TRef tr2;
  CTypeID id0;
  IRType t;
  CTypeID id;
  CType *ct;
  TRef tr;
  MSize i;
  CType *s [2];
  TRef sp [2];
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct_2;
  jit_State *local_310;
  CType *ct_1;
  jit_State *local_2f8;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  ct._4_4_ = 0;
  do {
    if (1 < ct._4_4_) {
      mm_00 = rd->data;
      if (((((mm_00 != MM_FAST) && (mm_00 != MM_concat)) &&
           ((pc._4_4_ = crec_arith_int64(J,(TRef *)(s + 1),(CType **)&tr,mm_00), pc._4_4_ != 0 ||
            (pc._4_4_ = crec_arith_ptr(J,(TRef *)(s + 1),(CType **)&tr,mm_00), pc._4_4_ != 0)))) ||
          (pc._4_4_ = crec_arith_meta(J,(TRef *)(s + 1),(CType **)&tr,cts_00,rd), pc._4_4_ != 0)) &&
         ((((*J->base = pc._4_4_, J->postproc == LJ_POST_FIXGUARD && ((J->L->base[-1].u64 & 7) == 2)
            ) && (((J->guardemit).irt & 0x80) == 0)) &&
          (puVar7 = (uint *)(J->L->base[-3].u64 - 4), (*puVar7 & 0xff) < 0xc)))) {
        *(uint **)&J[-1].penalty[0x31].val = puVar7;
        J->postproc = LJ_POST_FIXCOMP;
      }
      return;
    }
    ct._0_4_ = J->base[ct._4_4_];
    _t = (jit_State *)(cts_00->tab + 0xe);
    if ((uint)ct == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    if (((uint)ct & 0x1f000000) == 0xa000000) {
      pGVar5 = argv2cdata(J,(uint)ct,rd->argv + ct._4_4_);
      id0 = (CTypeID)pGVar5->ctypeid;
      local_310 = (jit_State *)(cts_00->tab + id0);
      while ((uint)(local_310->cur).nextgc.gcptr64 >> 0x1c == 8) {
        local_310 = (jit_State *)(cts_00->tab + ((uint)(local_310->cur).nextgc.gcptr64 & 0xffff));
      }
      _t = local_310;
      tr2 = crec_ct2irt(cts_00,(CType *)local_310);
      uVar1 = (ushort)tr2;
      IVar2 = (IRRef1)(uint)ct;
      if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 2) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4500;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x15;
        ct._0_4_ = lj_opt_fold(J);
        if (((_t->cur).nextgc.gcptr64 & 0xf0800000) == 0x20800000) {
          local_2f8 = _t;
          do {
            _t = (jit_State *)(cts_00->tab + ((uint)(local_2f8->cur).nextgc.gcptr64 & 0xffff));
            local_2f8 = _t;
          } while ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 8);
          tr2 = crec_ct2irt(cts_00,(CType *)_t);
        }
LAB_001b3869:
        if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 5) {
          _t = (jit_State *)(cts_00->tab + ((uint)(_t->cur).nextgc.gcptr64 & 0xffff));
        }
        if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 0) {
          if (tr2 == 10) {
            ct._0_4_ = 0;
          }
          else {
            (J->fold).ins.field_0.ot = (ushort)tr2 | 0x4600;
            (J->fold).ins.field_0.op1 = (IRRef1)(uint)ct;
            (J->fold).ins.field_0.op2 = 0;
            ct._0_4_ = lj_opt_fold(J);
          }
        }
      }
      else if ((tr2 == IRT_I64) || (tr2 == IRT_U64)) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4500;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x17;
        ct._0_4_ = lj_opt_fold(J);
      }
      else if ((tr2 == IRT_INT) || (tr2 == IRT_U32)) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4500;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x16;
        ct._0_4_ = lj_opt_fold(J);
        if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 5) {
          _t = (jit_State *)(cts_00->tab + ((uint)(_t->cur).nextgc.gcptr64 & 0xffff));
        }
      }
      else {
        if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c != 6) {
          TVar4 = lj_ir_kint64(J,0x10);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar2;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          ct._0_4_ = lj_opt_fold(J);
          goto LAB_001b3869;
        }
        if (ct._4_4_ == 0) {
          local_3ac = 0;
        }
        else {
          local_3ac = (CTypeID)(((long)_tr - (long)cts_00->tab) / 0x18);
        }
        id_1 = local_3ac;
        (J->fold).ins.field_0.ot = 0x4509;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x15;
        ct._0_4_ = lj_opt_fold(J);
        CVar3 = lj_ctype_intern(cts_00,(id0 | 0x30000) + 0x20000000,8);
        _t = (jit_State *)(cts_00->tab + CVar3);
        if (ct._4_4_ != 0) {
          _tr = cts_00->tab + id_1;
        }
      }
    }
    else if (((uint)ct & 0x1f000000) == 0) {
      ct._0_4_ = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      _t = (jit_State *)(cts_00->tab + 0x11);
    }
    else if (((uint)ct >> 0x18 & 0x1f) - 0xf < 5) {
      _t = (jit_State *)(cts_00->tab + 9);
    }
    else if (((uint)ct & 0x1f000000) == 0x4000000) {
      local_378 = J->base[1 - ct._4_4_];
      pGVar5 = argv2cdata(J,local_378,rd->argv + (1 - ct._4_4_));
      str._4_4_ = (uint)pGVar5->ctypeid;
      J_local = (jit_State *)(cts_00->tab + str._4_4_);
      while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
        J_local = (jit_State *)(cts_00->tab + ((uint)(J_local->cur).nextgc.gcptr64 & 0xffff));
      }
      _t = J_local;
      if ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 5) {
        pGStack_388 = (GCobj *)(rd->argv[ct._4_4_].u64 & 0x7fffffffffff);
        pCVar6 = lj_ctype_getfieldq(cts_00,(CType *)J_local,&pGStack_388->str,
                                    (CTSize *)((long)&cct + 4),(CTInfo *)0x0);
        if ((pCVar6 == (CType *)0x0) || (pCVar6->info >> 0x1c != 0xb)) {
          _t = (jit_State *)(cts_00->tab + 0x11);
        }
        else {
          IVar2 = (IRRef1)(uint)ct;
          TVar4 = lj_ir_kgc(J,pGStack_388,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = IVar2;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold(J);
          _t = (jit_State *)(cts_00->tab + (pCVar6->info & 0xffff));
          ct._0_4_ = lj_ir_kint(J,cct._4_4_);
        }
      }
      else if ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 2) {
        IVar2 = (IRRef1)(uint)ct;
        TVar4 = lj_ir_kint64(J,0x18);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        ct._0_4_ = lj_opt_fold(J);
      }
      else {
        _t = (jit_State *)(cts_00->tab + 0x11);
      }
    }
    else if (((uint)ct & 0x1f000000) != 0xe000000) {
      ct._0_4_ = 0;
      _t = (jit_State *)(cts_00->tab + 0x11);
    }
    *(jit_State **)(&tr + (ulong)ct._4_4_ * 2) = _t;
    sp[(ulong)ct._4_4_ - 2] = (uint)ct;
    ct._4_4_ = ct._4_4_ + 1;
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}